

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * QUtil::hex_encode(string *__return_storage_ptr__,string *input)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8), bVar2) {
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1);
    bVar1 = *pbVar3;
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"0123456789abcdef"[bVar1 >> 4]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"0123456789abcdef"[bVar1 & 0xf]);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::hex_encode(std::string const& input)
{
    static auto constexpr hexchars = "0123456789abcdef";
    std::string result;
    result.reserve(2 * input.length());
    for (const char c: input) {
        result += hexchars[static_cast<unsigned char>(c) >> 4];
        result += hexchars[c & 0x0f];
    }
    return result;
}